

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O2

void caffe::protobuf_caffe_2eproto::TableStruct::Shutdown(void)

{
  if (DAT_0078fcb0 == '\x01') {
    DAT_0078fcb0 = '\0';
    (*(code *)*_BlobShape_default_instance_)();
  }
  if (DAT_007910c8 != (long *)0x0) {
    (**(code **)(*DAT_007910c8 + 8))();
  }
  if (DAT_0078fd48 == '\x01') {
    DAT_0078fd48 = '\0';
    (*(code *)*_BlobProto_default_instance_)();
  }
  if (DAT_007910d8 != (long *)0x0) {
    (**(code **)(*DAT_007910d8 + 8))();
  }
  if (DAT_0078fd80 == '\x01') {
    DAT_0078fd80 = '\0';
    (*(code *)*_BlobProtoVector_default_instance_)();
  }
  if (DAT_007910e8 != (long *)0x0) {
    (**(code **)(*DAT_007910e8 + 8))();
  }
  if (DAT_0078fdd0 == '\x01') {
    DAT_0078fdd0 = '\0';
    (*(code *)*_Datum_default_instance_)();
  }
  if (DAT_007910f8 != (long *)0x0) {
    (**(code **)(*DAT_007910f8 + 8))();
  }
  if (DAT_0078fe18 == '\x01') {
    DAT_0078fe18 = '\0';
    (*(code *)*_FillerParameter_default_instance_)();
  }
  if (DAT_00791108 != (long *)0x0) {
    (**(code **)(*DAT_00791108 + 8))();
  }
  google::protobuf::internal::
  ExplicitlyConstructed<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::Shutdown((ExplicitlyConstructed<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&FillerParameter::_default_type__abi_cxx11_);
  if (DAT_0078fec0 == '\x01') {
    DAT_0078fec0 = '\0';
    (*(code *)*_NetParameter_default_instance_)();
  }
  if (DAT_00791118 != (long *)0x0) {
    (**(code **)(*DAT_00791118 + 8))();
  }
  if (DAT_0078fff8 == '\x01') {
    DAT_0078fff8 = '\0';
    (*(code *)*_SolverParameter_default_instance_)();
  }
  if (DAT_00791128 != (long *)0x0) {
    (**(code **)(*DAT_00791128 + 8))();
  }
  google::protobuf::internal::
  ExplicitlyConstructed<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::Shutdown((ExplicitlyConstructed<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&SolverParameter::_default_regularization_type__abi_cxx11_);
  google::protobuf::internal::
  ExplicitlyConstructed<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::Shutdown((ExplicitlyConstructed<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&SolverParameter::_default_type__abi_cxx11_);
  if (DAT_00790040 == '\x01') {
    DAT_00790040 = '\0';
    (*(code *)*_SolverState_default_instance_)();
  }
  if (DAT_00791138 != (long *)0x0) {
    (**(code **)(*DAT_00791138 + 8))();
  }
  if (DAT_00790080 == '\x01') {
    DAT_00790080 = '\0';
    (*(code *)*_NetState_default_instance_)();
  }
  if (DAT_00791148 != (long *)0x0) {
    (**(code **)(*DAT_00791148 + 8))();
  }
  if (DAT_007900e0 == '\x01') {
    DAT_007900e0 = '\0';
    (*(code *)*_NetStateRule_default_instance_)();
  }
  if (DAT_00791158 != (long *)0x0) {
    (**(code **)(*DAT_00791158 + 8))();
  }
  if (DAT_00790118 == '\x01') {
    DAT_00790118 = '\0';
    (*(code *)*_ParamSpec_default_instance_)();
  }
  if (DAT_00791168 != (long *)0x0) {
    (**(code **)(*DAT_00791168 + 8))();
  }
  if (DAT_00790378 == '\x01') {
    DAT_00790378 = '\0';
    (*(code *)*_LayerParameter_default_instance_)();
  }
  if (DAT_00791178 != (long *)0x0) {
    (**(code **)(*DAT_00791178 + 8))();
  }
  if (DAT_007903c0 == '\x01') {
    DAT_007903c0 = '\0';
    (*(code *)*_TransformationParameter_default_instance_)();
  }
  if (DAT_00791188 != (long *)0x0) {
    (**(code **)(*DAT_00791188 + 8))();
  }
  if (DAT_007903f0 == '\x01') {
    DAT_007903f0 = '\0';
    (*(code *)*_LossParameter_default_instance_)();
  }
  if (DAT_00791198 != (long *)0x0) {
    (**(code **)(*DAT_00791198 + 8))();
  }
  if (DAT_00790420 == '\x01') {
    DAT_00790420 = '\0';
    (*(code *)*_AccuracyParameter_default_instance_)();
  }
  if (DAT_007911a8 != (long *)0x0) {
    (**(code **)(*DAT_007911a8 + 8))();
  }
  if (DAT_00790450 == '\x01') {
    DAT_00790450 = '\0';
    (*(code *)*_ArgMaxParameter_default_instance_)();
  }
  if (DAT_007911b8 != (long *)0x0) {
    (**(code **)(*DAT_007911b8 + 8))();
  }
  if (DAT_00790478 == '\x01') {
    DAT_00790478 = '\0';
    (*(code *)*_ConcatParameter_default_instance_)();
  }
  if (DAT_007911c8 != (long *)0x0) {
    (**(code **)(*DAT_007911c8 + 8))();
  }
  if (DAT_007904a8 == '\x01') {
    DAT_007904a8 = '\0';
    (*(code *)*_BatchNormParameter_default_instance_)();
  }
  if (DAT_007911d8 != (long *)0x0) {
    (**(code **)(*DAT_007911d8 + 8))();
  }
  if (DAT_007904d8 == '\x01') {
    DAT_007904d8 = '\0';
    (*(code *)*_BiasParameter_default_instance_)();
  }
  if (DAT_007911e8 != (long *)0x0) {
    (**(code **)(*DAT_007911e8 + 8))();
  }
  if (DAT_00790500 == '\x01') {
    DAT_00790500 = '\0';
    (*(code *)*_ContrastiveLossParameter_default_instance_)();
  }
  if (DAT_007911f8 != (long *)0x0) {
    (**(code **)(*DAT_007911f8 + 8))();
  }
  if (DAT_007905a0 == '\x01') {
    DAT_007905a0 = '\0';
    (*(code *)*_ConvolutionParameter_default_instance_)();
  }
  if (DAT_00791208 != (long *)0x0) {
    (**(code **)(*DAT_00791208 + 8))();
  }
  if (DAT_007905d8 == '\x01') {
    DAT_007905d8 = '\0';
    (*(code *)*_CropParameter_default_instance_)();
  }
  if (DAT_00791218 != (long *)0x0) {
    (**(code **)(*DAT_00791218 + 8))();
  }
  if (DAT_00790628 == '\x01') {
    DAT_00790628 = '\0';
    (*(code *)*_DataParameter_default_instance_)();
  }
  if (DAT_00791228 != (long *)0x0) {
    (**(code **)(*DAT_00791228 + 8))();
  }
  if (DAT_00790650 == '\x01') {
    DAT_00790650 = '\0';
    (*(code *)*_DropoutParameter_default_instance_)();
  }
  if (DAT_00791238 != (long *)0x0) {
    (**(code **)(*DAT_00791238 + 8))();
  }
  if (DAT_007906e0 == '\x01') {
    DAT_007906e0 = '\0';
    (*(code *)*_DummyDataParameter_default_instance_)();
  }
  if (DAT_00791248 != (long *)0x0) {
    (**(code **)(*DAT_00791248 + 8))();
  }
  if (DAT_00790718 == '\x01') {
    DAT_00790718 = '\0';
    (*(code *)*_EltwiseParameter_default_instance_)();
  }
  if (DAT_00791258 != (long *)0x0) {
    (**(code **)(*DAT_00791258 + 8))();
  }
  if (DAT_00790740 == '\x01') {
    DAT_00790740 = '\0';
    (*(code *)*_ELUParameter_default_instance_)();
  }
  if (DAT_00791268 != (long *)0x0) {
    (**(code **)(*DAT_00791268 + 8))();
  }
  if (DAT_00790780 == '\x01') {
    DAT_00790780 = '\0';
    (*(code *)*_EmbedParameter_default_instance_)();
  }
  if (DAT_00791278 != (long *)0x0) {
    (**(code **)(*DAT_00791278 + 8))();
  }
  if (DAT_007907b0 == '\x01') {
    DAT_007907b0 = '\0';
    (*(code *)*_ExpParameter_default_instance_)();
  }
  if (DAT_00791288 != (long *)0x0) {
    (**(code **)(*DAT_00791288 + 8))();
  }
  if (DAT_007907d8 == '\x01') {
    DAT_007907d8 = '\0';
    (*(code *)*_FlattenParameter_default_instance_)();
  }
  if (DAT_00791298 != (long *)0x0) {
    (**(code **)(*DAT_00791298 + 8))();
  }
  if (DAT_00790808 == '\x01') {
    DAT_00790808 = '\0';
    (*(code *)*_HDF5DataParameter_default_instance_)();
  }
  if (DAT_007912a8 != (long *)0x0) {
    (**(code **)(*DAT_007912a8 + 8))();
  }
  if (DAT_00790830 == '\x01') {
    DAT_00790830 = '\0';
    (*(code *)*_HDF5OutputParameter_default_instance_)();
  }
  if (DAT_007912b8 != (long *)0x0) {
    (**(code **)(*DAT_007912b8 + 8))();
  }
  if (DAT_00790858 == '\x01') {
    DAT_00790858 = '\0';
    (*(code *)*_HingeLossParameter_default_instance_)();
  }
  if (DAT_007912c8 != (long *)0x0) {
    (**(code **)(*DAT_007912c8 + 8))();
  }
  if (DAT_007908b0 == '\x01') {
    DAT_007908b0 = '\0';
    (*(code *)*_ImageDataParameter_default_instance_)();
  }
  if (DAT_007912d8 != (long *)0x0) {
    (**(code **)(*DAT_007912d8 + 8))();
  }
  if (DAT_007908d8 == '\x01') {
    DAT_007908d8 = '\0';
    (*(code *)*_InfogainLossParameter_default_instance_)();
  }
  if (DAT_007912e8 != (long *)0x0) {
    (**(code **)(*DAT_007912e8 + 8))();
  }
  if (DAT_00790918 == '\x01') {
    DAT_00790918 = '\0';
    (*(code *)*_InnerProductParameter_default_instance_)();
  }
  if (DAT_007912f8 != (long *)0x0) {
    (**(code **)(*DAT_007912f8 + 8))();
  }
  if (DAT_00790950 == '\x01') {
    DAT_00790950 = '\0';
    (*(code *)*_InputParameter_default_instance_)();
  }
  if (DAT_00791308 != (long *)0x0) {
    (**(code **)(*DAT_00791308 + 8))();
  }
  if (DAT_00790980 == '\x01') {
    DAT_00790980 = '\0';
    (*(code *)*_LogParameter_default_instance_)();
  }
  if (DAT_00791318 != (long *)0x0) {
    (**(code **)(*DAT_00791318 + 8))();
  }
  if (DAT_007909b8 == '\x01') {
    DAT_007909b8 = '\0';
    (*(code *)*_LRNParameter_default_instance_)();
  }
  if (DAT_00791328 != (long *)0x0) {
    (**(code **)(*DAT_00791328 + 8))();
  }
  if (DAT_007909e8 == '\x01') {
    DAT_007909e8 = '\0';
    (*(code *)*_MemoryDataParameter_default_instance_)();
  }
  if (DAT_00791338 != (long *)0x0) {
    (**(code **)(*DAT_00791338 + 8))();
  }
  if (DAT_00790a10 == '\x01') {
    DAT_00790a10 = '\0';
    (*(code *)*_MVNParameter_default_instance_)();
  }
  if (DAT_00791348 != (long *)0x0) {
    (**(code **)(*DAT_00791348 + 8))();
  }
  if (DAT_00790a38 == '\x01') {
    DAT_00790a38 = '\0';
    (*(code *)*_ParameterParameter_default_instance_)();
  }
  if (DAT_00791358 != (long *)0x0) {
    (**(code **)(*DAT_00791358 + 8))();
  }
  if (DAT_00790a88 == '\x01') {
    DAT_00790a88 = '\0';
    (*(code *)*_PoolingParameter_default_instance_)();
  }
  if (DAT_00791368 != (long *)0x0) {
    (**(code **)(*DAT_00791368 + 8))();
  }
  if (DAT_00790ab8 == '\x01') {
    DAT_00790ab8 = '\0';
    (*(code *)*_PowerParameter_default_instance_)();
  }
  if (DAT_00791378 != (long *)0x0) {
    (**(code **)(*DAT_00791378 + 8))();
  }
  if (DAT_00790af8 == '\x01') {
    DAT_00790af8 = '\0';
    (*(code *)*_PythonParameter_default_instance_)();
  }
  if (DAT_00791388 != (long *)0x0) {
    (**(code **)(*DAT_00791388 + 8))();
  }
  if (DAT_00790b30 == '\x01') {
    DAT_00790b30 = '\0';
    (*(code *)*_RecurrentParameter_default_instance_)();
  }
  if (DAT_00791398 != (long *)0x0) {
    (**(code **)(*DAT_00791398 + 8))();
  }
  if (DAT_00790b60 == '\x01') {
    DAT_00790b60 = '\0';
    (*(code *)*_ReductionParameter_default_instance_)();
  }
  if (DAT_007913a8 != (long *)0x0) {
    (**(code **)(*DAT_007913a8 + 8))();
  }
  if (DAT_00790b88 == '\x01') {
    DAT_00790b88 = '\0';
    (*(code *)*_ReLUParameter_default_instance_)();
  }
  if (DAT_007913b8 != (long *)0x0) {
    (**(code **)(*DAT_007913b8 + 8))();
  }
  if (DAT_00790bb8 == '\x01') {
    DAT_00790bb8 = '\0';
    (*(code *)*_ReshapeParameter_default_instance_)();
  }
  if (DAT_007913c8 != (long *)0x0) {
    (**(code **)(*DAT_007913c8 + 8))();
  }
  if (DAT_00790bf8 == '\x01') {
    DAT_00790bf8 = '\0';
    (*(code *)*_ScaleParameter_default_instance_)();
  }
  if (DAT_007913d8 != (long *)0x0) {
    (**(code **)(*DAT_007913d8 + 8))();
  }
  if (DAT_00790c20 == '\x01') {
    DAT_00790c20 = '\0';
    (*(code *)*_SigmoidParameter_default_instance_)();
  }
  if (DAT_007913e8 != (long *)0x0) {
    (**(code **)(*DAT_007913e8 + 8))();
  }
  if (DAT_00790c58 == '\x01') {
    DAT_00790c58 = '\0';
    (*(code *)*_SliceParameter_default_instance_)();
  }
  if (DAT_007913f8 != (long *)0x0) {
    (**(code **)(*DAT_007913f8 + 8))();
  }
  if (DAT_00790c80 == '\x01') {
    DAT_00790c80 = '\0';
    (*(code *)*_SoftmaxParameter_default_instance_)();
  }
  if (DAT_00791408 != (long *)0x0) {
    (**(code **)(*DAT_00791408 + 8))();
  }
  if (DAT_00790ca8 == '\x01') {
    DAT_00790ca8 = '\0';
    (*(code *)*_TanHParameter_default_instance_)();
  }
  if (DAT_00791418 != (long *)0x0) {
    (**(code **)(*DAT_00791418 + 8))();
  }
  if (DAT_00790cd0 == '\x01') {
    DAT_00790cd0 = '\0';
    (*(code *)*_TileParameter_default_instance_)();
  }
  if (DAT_00791428 != (long *)0x0) {
    (**(code **)(*DAT_00791428 + 8))();
  }
  if (DAT_00790cf8 == '\x01') {
    DAT_00790cf8 = '\0';
    (*(code *)*_ThresholdParameter_default_instance_)();
  }
  if (DAT_00791438 != (long *)0x0) {
    (**(code **)(*DAT_00791438 + 8))();
  }
  if (DAT_00790d58 == '\x01') {
    DAT_00790d58 = '\0';
    (*(code *)*_WindowDataParameter_default_instance_)();
  }
  if (DAT_00791448 != (long *)0x0) {
    (**(code **)(*DAT_00791448 + 8))();
  }
  google::protobuf::internal::
  ExplicitlyConstructed<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::Shutdown((ExplicitlyConstructed<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&WindowDataParameter::_default_crop_mode__abi_cxx11_);
  if (DAT_00790d88 == '\x01') {
    DAT_00790d88 = '\0';
    (*(code *)*_SPPParameter_default_instance_)();
  }
  if (DAT_00791458 != (long *)0x0) {
    (**(code **)(*DAT_00791458 + 8))();
  }
  if (DAT_00790f80 == '\x01') {
    DAT_00790f80 = '\0';
    (*(code *)*_V1LayerParameter_default_instance_)();
  }
  if (DAT_00791468 != (long *)0x0) {
    (**(code **)(*DAT_00791468 + 8))();
  }
  if (DAT_00791088 == '\x01') {
    DAT_00791088 = '\0';
    (*(code *)*_V0LayerParameter_default_instance_)();
  }
  if (DAT_00791478 != (long *)0x0) {
    (**(code **)(*DAT_00791478 + 8))();
  }
  google::protobuf::internal::
  ExplicitlyConstructed<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::Shutdown((ExplicitlyConstructed<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&V0LayerParameter::_default_det_crop_mode__abi_cxx11_);
  if (DAT_007910b8 == '\x01') {
    DAT_007910b8 = '\0';
    (*(code *)*_PReLUParameter_default_instance_)();
  }
  if (DAT_00791488 != (long *)0x0) {
    (**(code **)(*DAT_00791488 + 8))();
    return;
  }
  return;
}

Assistant:

void TableStruct::Shutdown() {
  _BlobShape_default_instance_.Shutdown();
  delete file_level_metadata[0].reflection;
  _BlobProto_default_instance_.Shutdown();
  delete file_level_metadata[1].reflection;
  _BlobProtoVector_default_instance_.Shutdown();
  delete file_level_metadata[2].reflection;
  _Datum_default_instance_.Shutdown();
  delete file_level_metadata[3].reflection;
  _FillerParameter_default_instance_.Shutdown();
  delete file_level_metadata[4].reflection;
  FillerParameter::_default_type_.Shutdown();
  _NetParameter_default_instance_.Shutdown();
  delete file_level_metadata[5].reflection;
  _SolverParameter_default_instance_.Shutdown();
  delete file_level_metadata[6].reflection;
  SolverParameter::_default_regularization_type_.Shutdown();
  SolverParameter::_default_type_.Shutdown();
  _SolverState_default_instance_.Shutdown();
  delete file_level_metadata[7].reflection;
  _NetState_default_instance_.Shutdown();
  delete file_level_metadata[8].reflection;
  _NetStateRule_default_instance_.Shutdown();
  delete file_level_metadata[9].reflection;
  _ParamSpec_default_instance_.Shutdown();
  delete file_level_metadata[10].reflection;
  _LayerParameter_default_instance_.Shutdown();
  delete file_level_metadata[11].reflection;
  _TransformationParameter_default_instance_.Shutdown();
  delete file_level_metadata[12].reflection;
  _LossParameter_default_instance_.Shutdown();
  delete file_level_metadata[13].reflection;
  _AccuracyParameter_default_instance_.Shutdown();
  delete file_level_metadata[14].reflection;
  _ArgMaxParameter_default_instance_.Shutdown();
  delete file_level_metadata[15].reflection;
  _ConcatParameter_default_instance_.Shutdown();
  delete file_level_metadata[16].reflection;
  _BatchNormParameter_default_instance_.Shutdown();
  delete file_level_metadata[17].reflection;
  _BiasParameter_default_instance_.Shutdown();
  delete file_level_metadata[18].reflection;
  _ContrastiveLossParameter_default_instance_.Shutdown();
  delete file_level_metadata[19].reflection;
  _ConvolutionParameter_default_instance_.Shutdown();
  delete file_level_metadata[20].reflection;
  _CropParameter_default_instance_.Shutdown();
  delete file_level_metadata[21].reflection;
  _DataParameter_default_instance_.Shutdown();
  delete file_level_metadata[22].reflection;
  _DropoutParameter_default_instance_.Shutdown();
  delete file_level_metadata[23].reflection;
  _DummyDataParameter_default_instance_.Shutdown();
  delete file_level_metadata[24].reflection;
  _EltwiseParameter_default_instance_.Shutdown();
  delete file_level_metadata[25].reflection;
  _ELUParameter_default_instance_.Shutdown();
  delete file_level_metadata[26].reflection;
  _EmbedParameter_default_instance_.Shutdown();
  delete file_level_metadata[27].reflection;
  _ExpParameter_default_instance_.Shutdown();
  delete file_level_metadata[28].reflection;
  _FlattenParameter_default_instance_.Shutdown();
  delete file_level_metadata[29].reflection;
  _HDF5DataParameter_default_instance_.Shutdown();
  delete file_level_metadata[30].reflection;
  _HDF5OutputParameter_default_instance_.Shutdown();
  delete file_level_metadata[31].reflection;
  _HingeLossParameter_default_instance_.Shutdown();
  delete file_level_metadata[32].reflection;
  _ImageDataParameter_default_instance_.Shutdown();
  delete file_level_metadata[33].reflection;
  _InfogainLossParameter_default_instance_.Shutdown();
  delete file_level_metadata[34].reflection;
  _InnerProductParameter_default_instance_.Shutdown();
  delete file_level_metadata[35].reflection;
  _InputParameter_default_instance_.Shutdown();
  delete file_level_metadata[36].reflection;
  _LogParameter_default_instance_.Shutdown();
  delete file_level_metadata[37].reflection;
  _LRNParameter_default_instance_.Shutdown();
  delete file_level_metadata[38].reflection;
  _MemoryDataParameter_default_instance_.Shutdown();
  delete file_level_metadata[39].reflection;
  _MVNParameter_default_instance_.Shutdown();
  delete file_level_metadata[40].reflection;
  _ParameterParameter_default_instance_.Shutdown();
  delete file_level_metadata[41].reflection;
  _PoolingParameter_default_instance_.Shutdown();
  delete file_level_metadata[42].reflection;
  _PowerParameter_default_instance_.Shutdown();
  delete file_level_metadata[43].reflection;
  _PythonParameter_default_instance_.Shutdown();
  delete file_level_metadata[44].reflection;
  _RecurrentParameter_default_instance_.Shutdown();
  delete file_level_metadata[45].reflection;
  _ReductionParameter_default_instance_.Shutdown();
  delete file_level_metadata[46].reflection;
  _ReLUParameter_default_instance_.Shutdown();
  delete file_level_metadata[47].reflection;
  _ReshapeParameter_default_instance_.Shutdown();
  delete file_level_metadata[48].reflection;
  _ScaleParameter_default_instance_.Shutdown();
  delete file_level_metadata[49].reflection;
  _SigmoidParameter_default_instance_.Shutdown();
  delete file_level_metadata[50].reflection;
  _SliceParameter_default_instance_.Shutdown();
  delete file_level_metadata[51].reflection;
  _SoftmaxParameter_default_instance_.Shutdown();
  delete file_level_metadata[52].reflection;
  _TanHParameter_default_instance_.Shutdown();
  delete file_level_metadata[53].reflection;
  _TileParameter_default_instance_.Shutdown();
  delete file_level_metadata[54].reflection;
  _ThresholdParameter_default_instance_.Shutdown();
  delete file_level_metadata[55].reflection;
  _WindowDataParameter_default_instance_.Shutdown();
  delete file_level_metadata[56].reflection;
  WindowDataParameter::_default_crop_mode_.Shutdown();
  _SPPParameter_default_instance_.Shutdown();
  delete file_level_metadata[57].reflection;
  _V1LayerParameter_default_instance_.Shutdown();
  delete file_level_metadata[58].reflection;
  _V0LayerParameter_default_instance_.Shutdown();
  delete file_level_metadata[59].reflection;
  V0LayerParameter::_default_det_crop_mode_.Shutdown();
  _PReLUParameter_default_instance_.Shutdown();
  delete file_level_metadata[60].reflection;
}